

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::clear
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this)

{
  CGlyphIndex *pCVar1;
  
  if (this->list != (CGlyphIndex *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pCVar1 = (CGlyphIndex *)operator_new__(0x10);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}